

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteLocals
          (CWriter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *index_to_name)

{
  Func *pFVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer ppVar4;
  Type TVar5;
  pointer pbVar6;
  uint uVar7;
  char *pcVar8;
  size_t size;
  ulong uVar9;
  long lVar10;
  char (*extraout_RDX) [2];
  char (*extraout_RDX_00) [2];
  char (*u) [2];
  char (*extraout_RDX_01) [2];
  Newline *u_00;
  ulong uVar11;
  uint uVar12;
  pointer ppVar13;
  bool bVar14;
  string_view include_condition;
  string_view name;
  size_t sStack_a0;
  Type type;
  Type local_58;
  string local_50;
  
  pFVar1 = this->func_;
  pTVar2 = (pFVar1->decl).sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = (pFVar1->decl).sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 4) {
    Type::Type(&type,*(Enum *)((long)&DAT_001e94dc + lVar10));
    ppVar13 = (pFVar1->local_types).decls_.
              super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (pFVar1->local_types).decls_.
             super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar12 = 0;
    uVar11 = (ulong)((long)pTVar2 - (long)pTVar3) >> 3 & 0xffffffff;
    uVar9 = 0;
    u = extraout_RDX;
    while ((ppVar13 != ppVar4 || (uVar12 != 0))) {
      TVar5 = ppVar13->first;
      if (TVar5 == type) {
        if (uVar9 == 0) {
          (anonymous_namespace)::CWriter::Write<wabt::Type&,char_const(&)[2]>
                    ((CWriter *)this,&type,u);
          include_condition._M_str = "exceptions";
          include_condition._M_len = 10;
          PushFuncSection(this,include_condition);
          WriteData(this,"volatile ",9);
          PushFuncSection(this,(string_view)(ZEXT816(0x1d8897) << 0x40));
          this->indent_ = this->indent_ + 4;
        }
        else {
          WriteData(this,", ",2);
          if ((uVar9 & 7) == 0) {
            Write(this);
          }
        }
        pbVar6 = (index_to_name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        name._M_str = pbVar6[uVar11]._M_dataplus._M_p;
        name._M_len = pbVar6[uVar11]._M_string_length;
        local_58 = TVar5;
        (anonymous_namespace)::CWriter::DefineParamName_abi_cxx11_(&local_50,(CWriter *)this,name);
        WriteData(this,local_50._M_dataplus._M_p,local_50._M_string_length);
        WriteData(this," = ",3);
        std::__cxx11::string::_M_dispose();
        uVar7 = TVar5.enum_ + 0x17;
        if ((uVar7 < 8) && ((0xc5U >> (uVar7 & 0x1f) & 1) != 0)) {
          pcVar8 = GetReferenceNullValue(&local_58);
          size = strlen(pcVar8);
          WriteData(this,pcVar8,size);
          u = extraout_RDX_00;
        }
        else {
          if (TVar5.enum_ == V128) {
            pcVar8 = "simde_wasm_i64x2_make(0, 0)";
            sStack_a0 = 0x1b;
          }
          else {
            pcVar8 = "0";
            sStack_a0 = 1;
          }
          WriteData(this,pcVar8,sStack_a0);
          u = extraout_RDX_01;
        }
        uVar9 = uVar9 + 1;
      }
      uVar12 = uVar12 + 1;
      bVar14 = ppVar13->second <= uVar12;
      if (bVar14) {
        ppVar13 = ppVar13 + 1;
      }
      if (bVar14) {
        uVar12 = 0;
      }
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    if (uVar9 != 0) {
      Dedent(this,4);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [2])0x1e5996,u_00);
    }
  }
  return;
}

Assistant:

void CWriter::WriteLocals(const std::vector<std::string>& index_to_name) {
  Index num_params = func_->GetNumParams();
  WriteVarsByType(
      func_->local_types, [](auto x) { return x; },
      [&](Index local_index, Type local_type) {
        Write(DefineParamName(index_to_name[num_params + local_index]), " = ");
        if (local_type.IsRef()) {
          Write(GetReferenceNullValue(local_type));
        } else if (local_type == Type::V128) {
          Write("simde_wasm_i64x2_make(0, 0)");
        } else {
          Write("0");
        }
      },
      true);
}